

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

bool __thiscall cmake::StartDebuggerIfEnabled(cmake *this)

{
  bool bVar1;
  undefined1 auStack_88 [32];
  string local_68 [8];
  long local_60;
  string local_48 [32];
  
  bVar1 = true;
  if ((this->DebuggerOn == true) &&
     ((this->DebugAdapter).
      super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0)) {
    std::__cxx11::string::string(local_68,(string *)&this->DebuggerPipe);
    std::__cxx11::string::~string(local_68);
    if (local_60 == 0) {
      std::operator<<((ostream *)&std::cerr,
                      "Error: --debugger-pipe must be set when debugging is enabled.\n");
      bVar1 = false;
    }
    else {
      std::__cxx11::string::string(local_68,(string *)&this->DebuggerPipe);
      std::make_shared<cmDebugger::cmDebuggerPipeConnection_POSIX,std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_88);
      std::__cxx11::string::string(local_48,(string *)&this->DebuggerDapLogFile);
      std::
      make_shared<cmDebugger::cmDebuggerAdapter,std::shared_ptr<cmDebugger::cmDebuggerPipeConnection_POSIX>,std::__cxx11::string>
                ((shared_ptr<cmDebugger::cmDebuggerPipeConnection_POSIX> *)(auStack_88 + 0x10),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_88);
      std::__shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->DebugAdapter).
                  super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2> *)
                 (auStack_88 + 0x10));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_88 + 0x18));
      std::__cxx11::string::~string(local_48);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_88 + 8));
      std::__cxx11::string::~string(local_68);
      std::__shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(((this->Messenger)._M_t.
                    super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
                    super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
                    super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl)->DebuggerAdapter).
                  super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>,
                 &(this->DebugAdapter).
                  super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>);
    }
  }
  return bVar1;
}

Assistant:

bool cmake::StartDebuggerIfEnabled()
{
  if (!this->GetDebuggerOn()) {
    return true;
  }

  if (DebugAdapter == nullptr) {
    if (this->GetDebuggerPipe().empty()) {
      std::cerr
        << "Error: --debugger-pipe must be set when debugging is enabled.\n";
      return false;
    }

    try {
      DebugAdapter = std::make_shared<cmDebugger::cmDebuggerAdapter>(
        std::make_shared<cmDebugger::cmDebuggerPipeConnection>(
          this->GetDebuggerPipe()),
        this->GetDebuggerDapLogFile());
    } catch (const std::runtime_error& error) {
      std::cerr << "Error: Failed to create debugger adapter.\n";
      std::cerr << error.what() << "\n";
      return false;
    }
    Messenger->SetDebuggerAdapter(DebugAdapter);
  }

  return true;
}